

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_b44ed7::GetList
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *list,string *var,cmMakefile *makefile)

{
  bool bVar1;
  bool bVar2;
  PolicyStatus PVar3;
  PolicyID id;
  PolicyID id_00;
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  string listString;
  undefined1 local_c0 [48];
  string local_90;
  string warn;
  cmAlphaNum local_50;
  
  listString._M_dataplus._M_p = (pointer)&listString.field_2;
  listString._M_string_length = 0;
  listString.field_2._M_local_buf[0] = '\0';
  bVar1 = GetListString(&listString,var,makefile);
  if (bVar1) {
    bVar1 = true;
    if (listString._M_string_length == 0) goto LAB_002b7344;
    arg._M_str = listString._M_dataplus._M_p;
    arg._M_len = listString._M_string_length;
    cmExpandList(arg,list,true);
    local_c0._0_8_ = local_c0 + 0x10;
    local_c0._8_8_ = (pointer)0x0;
    local_c0[0x10] = '\0';
    bVar2 = ::cm::
            contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (list,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_c0);
    std::__cxx11::string::~string((string *)local_c0);
    if (!bVar2) goto LAB_002b7344;
    PVar3 = cmMakefile::GetPolicyStatus(makefile,CMP0007,false);
    if (1 < PVar3 - REQUIRED_IF_USED) {
      if (PVar3 == OLD) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(list);
        arg_01._M_str = listString._M_dataplus._M_p;
        arg_01._M_len = listString._M_string_length;
        cmExpandList(arg_01,list,false);
      }
      else if (PVar3 == WARN) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(list);
        arg_00._M_str = listString._M_dataplus._M_p;
        arg_00._M_len = listString._M_string_length;
        cmExpandList(arg_00,list,false);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_90,(cmPolicies *)0x7,id_00);
        local_c0._0_8_ = local_90._M_string_length;
        local_c0._8_8_ = local_90._M_dataplus._M_p;
        local_50.View_._M_len = 0x13;
        local_50.View_._M_str = " List has value = [";
        cmStrCat<std::__cxx11::string,char[3]>
                  (&warn,(cmAlphaNum *)local_c0,&local_50,&listString,(char (*) [3])"].");
        std::__cxx11::string::~string((string *)&local_90);
        cmMakefile::IssueMessage(makefile,AUTHOR_WARNING,&warn);
        std::__cxx11::string::~string((string *)&warn);
      }
      goto LAB_002b7344;
    }
    cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)local_c0,(cmPolicies *)0x7,id);
    cmMakefile::IssueMessage(makefile,FATAL_ERROR,(string *)local_c0);
    std::__cxx11::string::~string((string *)local_c0);
  }
  bVar1 = false;
LAB_002b7344:
  std::__cxx11::string::~string((string *)&listString);
  return bVar1;
}

Assistant:

bool GetList(std::vector<std::string>& list, const std::string& var,
             const cmMakefile& makefile)
{
  std::string listString;
  if (!GetListString(listString, var, makefile)) {
    return false;
  }
  // if the size of the list
  if (listString.empty()) {
    return true;
  }
  // expand the variable into a list
  cmExpandList(listString, list, true);
  // if no empty elements then just return
  if (!cm::contains(list, std::string())) {
    return true;
  }
  // if we have empty elements we need to check policy CMP0007
  switch (makefile.GetPolicyStatus(cmPolicies::CMP0007)) {
    case cmPolicies::WARN: {
      // Default is to warn and use old behavior
      // OLD behavior is to allow compatibility, so recall
      // ExpandListArgument without the true which will remove
      // empty values
      list.clear();
      cmExpandList(listString, list);
      std::string warn =
        cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0007),
                 " List has value = [", listString, "].");
      makefile.IssueMessage(MessageType::AUTHOR_WARNING, warn);
      return true;
    }
    case cmPolicies::OLD:
      // OLD behavior is to allow compatibility, so recall
      // ExpandListArgument without the true which will remove
      // empty values
      list.clear();
      cmExpandList(listString, list);
      return true;
    case cmPolicies::NEW:
      return true;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
      makefile.IssueMessage(
        MessageType::FATAL_ERROR,
        cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0007));
      return false;
  }
  return true;
}